

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int process_global_unset(archive_read *a,mtree_option **global,char *line)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t len;
  char *next;
  char *line_local;
  mtree_option **global_local;
  archive_read *a_local;
  
  next = line + 6;
  pcVar2 = strchr(next,0x3d);
  if (pcVar2 == (char *)0x0) {
    while( true ) {
      sVar3 = strspn(next," \t\r\n");
      pcVar2 = next + sVar3;
      if (*pcVar2 == '\0') break;
      sVar3 = strcspn(pcVar2," \t\r\n");
      if ((sVar3 == 3) && (iVar1 = strncmp(pcVar2,"all",3), iVar1 == 0)) {
        free_options(*global);
        *global = (mtree_option *)0x0;
      }
      else {
        remove_option(global,pcVar2,sVar3);
      }
      next = pcVar2 + sVar3;
    }
    a_local._4_4_ = 0;
  }
  else {
    archive_set_error(&a->archive,-1,"/unset shall not contain `=\'");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
process_global_unset(struct archive_read *a,
    struct mtree_option **global, const char *line)
{
	const char *next;
	size_t len;

	line += 6;
	if (strchr(line, '=') != NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "/unset shall not contain `='");
		return ARCHIVE_FATAL;
	}

	for (;;) {
		next = line + strspn(line, " \t\r\n");
		if (*next == '\0')
			return (ARCHIVE_OK);
		line = next;
		len = strcspn(line, " \t\r\n");

		if (len == 3 && strncmp(line, "all", 3) == 0) {
			free_options(*global);
			*global = NULL;
		} else {
			remove_option(global, line, len);
		}

		line += len;
	}
}